

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O2

bool __thiscall VolumeFile::unpackAll(VolumeFile *this,string *outDirectory)

{
  uint32_t uVar1;
  EntryBTree rootEntryBtree;
  EntryUnpacker unpacker;
  pointer local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [48];
  
  uVar1 = this->m_entryTreeCount;
  if (uVar1 != 0) {
    local_68 = local_58;
    local_70 = (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start +
               *(this->m_entryTreeOffsets).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_60 = 0;
    local_58[0] = 0;
    local_48._0_8_ = this;
    local_48._8_8_ = outDirectory;
    std::__cxx11::string::string((string *)(local_48 + 0x10),(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    BTree<EntryBTree,EntryKey>::traverse<EntryUnpacker_const>
              ((BTree<EntryBTree,EntryKey> *)&local_70,(EntryUnpacker *)local_48);
    std::__cxx11::string::~string((string *)(local_48 + 0x10));
  }
  return uVar1 != 0;
}

Assistant:

bool VolumeFile::unpackAll(const std::string& outDirectory)
{
	if (m_entryTreeCount == 0) {
		return false;
	}
	
	const EntryBTree rootEntryBtree(
		advancePointer(m_data.data(), entryTreeOffset(0))
	);
	const EntryUnpacker unpacker(*this, outDirectory);
	rootEntryBtree.traverse(unpacker);

	return true;
}